

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.h
# Opt level: O1

void __thiscall chrono::ChBodyEasyCylinder::~ChBodyEasyCylinder(ChBodyEasyCylinder *this)

{
  ChBody::~ChBody((ChBody *)
                  &this[-1].super_ChBody.forcelist.
                   super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&PTR_construction_vtable_24__00b2ecd0)
  ;
  free(this[-1].super_ChBody.forcelist.
       super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

class ChApi ChBodyEasyCylinder : public ChBody {
  public:
    /// Create a ChBody with optional cylinder visualization and/or collision shape. The cylinder is created along the Y
    /// axis and centered at the center of mass. Mass and inertia are set automatically depending on density.
    ChBodyEasyCylinder(double radius,                                          ///< radius of the cylinder
                       double height,                                          ///< height of the cylinder
                       double density,                                         ///< density of the body
                       bool visualize = true,                                  ///< create visualization asset
                       bool collide = false,                                   ///< enable collision
                       std::shared_ptr<ChMaterialSurface> material = nullptr,  ///< surface contact material
                       std::shared_ptr<collision::ChCollisionModel> collision_model =
                           chrono_types::make_shared<collision::ChCollisionModelBullet>()  ///< collision model
    );

    /// Create a ChBody with a cylinder visualization and collision shape using the specified collision model type. The
    /// cylinder is created along the Y axis and centered at the center of mass. Mass and inertia are set automatically
    /// depending on density.
    ChBodyEasyCylinder(double radius,                                   ///< radius of the cylinder
                       double height,                                   ///< height of the cylinder
                       double density,                                  ///< density of the body
                       std::shared_ptr<ChMaterialSurface> material,     ///< surface contact material
                       collision::ChCollisionSystemType collision_type  ///< collision model type
    );

  private:
    void SetupBody(double radius,
                   double height,
                   double density,
                   bool visualize,
                   bool collide,
                   std::shared_ptr<ChMaterialSurface> material);
}